

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall
Fifteen::drawNumberOnTile
          (Fifteen *this,QIcon *icon,QPixmap *pixmap,size_t fontSize,size_t number,
          NumberColor numberColor)

{
  QString local_b0;
  undefined1 local_94 [16];
  undefined1 local_84 [8];
  QColor color;
  QString local_68;
  QFont local_50 [16];
  QPainter local_40 [8];
  QPainter painter;
  NumberColor numberColor_local;
  size_t number_local;
  size_t fontSize_local;
  QPixmap *pixmap_local;
  QIcon *icon_local;
  Fifteen *this_local;
  
  QPainter::QPainter(local_40,(QPaintDevice *)pixmap);
  QString::QString(&local_68,"Times");
  number_local._0_4_ = (int)fontSize;
  QFont::QFont(local_50,(QString *)&local_68,(int)number_local,700,false);
  QPainter::setFont((QFont *)local_40);
  QFont::~QFont(local_50);
  QString::~QString(&local_68);
  if (numberColor == WHITE) {
    QColor::QColor((QColor *)local_84,0xff,0xff,0xff,0xff);
  }
  else {
    QColor::QColor((QColor *)local_84,0,0,0,0xff);
  }
  QPainter::setPen((QColor *)local_40);
  local_94 = QPixmap::rect();
  QString::number((ulong)&local_b0,(int)number + 1);
  QPainter::drawText((QRect *)local_40,(int)local_94,(QString *)0x84,(QRect *)&local_b0);
  QString::~QString(&local_b0);
  QIcon::addPixmap(icon,pixmap,0,1);
  QPainter::end();
  QPainter::~QPainter(local_40);
  return;
}

Assistant:

void Fifteen::drawNumberOnTile( QIcon& icon, QPixmap& pixmap, size_t fontSize, size_t number, NumberColor numberColor )
{
    QPainter painter( &pixmap );
    painter.setFont( QFont( "Times", fontSize, QFont::Bold ));
    QColor color = numberColor == NumberColor::WHITE ? QColor( 255, 255, 255 ) : QColor( 0, 0, 0 );
    painter.setPen( color );
    painter.drawText( pixmap.rect(), Qt::AlignCenter, QString::number( number + 1 ));
    icon.addPixmap( pixmap );
    painter.end();
}